

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O2

int Pdr_ObjSatVar2(Pdr_Man_t *p,int k,Aig_Obj_t *pObj,int Level,int Pol)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  sat_solver *s;
  Vec_Int_t *p_00;
  int **ppiVar6;
  Aig_Obj_t *pObj_00;
  int iVar7;
  uint *puVar8;
  Vec_Int_t *pVVar9;
  int Lit;
  long local_40;
  sat_solver *local_38;
  
  if (p->pCnf2->pObj2Count[pObj->Id] < 0) {
    __assert_fail("p->pCnf2->pObj2Count[Aig_ObjId(pObj)] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                  ,0xb0,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
  }
  pVVar9 = p->pvId2Vars + pObj->Id;
  iVar2 = pVVar9->nSize;
  if (iVar2 == 0) {
    Vec_IntGrow(pVVar9,k * 2 + 1);
    iVar2 = pVVar9->nSize;
  }
  if (iVar2 <= k) {
    iVar7 = k + 1;
    iVar4 = pVVar9->nCap * 2;
    iVar3 = iVar7;
    if ((iVar4 <= k) || (iVar3 = iVar4, pVVar9->nCap <= k)) {
      Vec_IntGrow(pVVar9,iVar3);
      iVar2 = pVVar9->nSize;
    }
    for (lVar5 = (long)iVar2; lVar5 < iVar7; lVar5 = lVar5 + 1) {
      pVVar9->pArray[lVar5] = 0;
    }
    pVVar9->nSize = iVar7;
  }
  iVar2 = Vec_IntEntry(pVVar9,k);
  if (iVar2 == 0) {
    s = Pdr_ManSolver(p,k);
    p_00 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,k);
    iVar4 = p_00->nSize;
    if (iVar4 < 1) {
      __assert_fail("iVarNew > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                    ,0xb8,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
    }
    Vec_IntPush(p_00,pObj->Id);
    Vec_IntWriteEntry(pVVar9,k,iVar4);
    sat_solver_setnvars(s,iVar4 + 1);
    if ((k == 0) && ((*(uint *)&pObj->field_0x18 & 7) == 2)) {
      pAVar1 = p->pAig;
      iVar3 = Aig_ObjCioId(pObj);
      if (pAVar1->nTruePis <= iVar3) {
        Lit = Abc_Var2Lit(iVar4,1);
        iVar4 = sat_solver_addclause(s,&Lit,(lit *)&local_40);
        if (iVar4 != 1) {
          __assert_fail("RetValue == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                        ,0xc0,"int Pdr_ObjSatVar2FindOrAdd(Pdr_Man_t *, int, Aig_Obj_t *, int *)");
        }
        if (s->qtail != s->qhead) {
          iVar4 = sat_solver_simplify(s);
          if (iVar4 == 0) {
            __assert_fail("RetValue != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0x102,"void sat_solver_compress(sat_solver *)");
          }
        }
      }
    }
  }
  iVar4 = Vec_IntEntry(pVVar9,k);
  if ((iVar2 == 0) && (((uint)*(undefined8 *)&pObj->field_0x18 & 7) != 2)) {
    local_40 = (long)p->pCnf2->pObj2Count[pObj->Id];
    if (local_40 < 1) {
      __assert_fail("iClaBeg < iClaEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                    ,0xd2,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
    }
    lVar5 = (long)p->pCnf2->pObj2Clause[pObj->Id];
    local_38 = Pdr_ManSolver(p,k);
    if ((Level < 0) || (p->vVLits->nSize <= Level)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    local_40 = local_40 + lVar5;
    pVVar9 = p->vVLits->pArray + (uint)Level;
    while (lVar5 < local_40) {
      pVVar9->nSize = 0;
      iVar2 = Abc_LitIsCompl(*p->pCnf2->pClauses[lVar5]);
      iVar2 = Abc_Var2Lit(iVar4,iVar2);
      Vec_IntPush(pVVar9,iVar2);
      ppiVar6 = p->pCnf2->pClauses;
      puVar8 = (uint *)ppiVar6[lVar5];
      lVar5 = lVar5 + 1;
      while (puVar8 = puVar8 + 1, puVar8 < ppiVar6[lVar5]) {
        if ((int)*puVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        pObj_00 = Aig_ManObj(p->pAig,*puVar8 >> 1);
        iVar2 = Pdr_ObjSatVar2(p,k,pObj_00,Level + 1,Pol);
        iVar3 = Abc_LitIsCompl(*puVar8);
        iVar2 = Abc_Var2Lit(iVar2,iVar3);
        Vec_IntPush(pVVar9,iVar2);
        ppiVar6 = p->pCnf2->pClauses;
      }
      iVar2 = sat_solver_addclause(local_38,pVVar9->pArray,pVVar9->pArray + pVVar9->nSize);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                      ,0xdf,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
      }
    }
  }
  return iVar4;
}

Assistant:

int Pdr_ObjSatVar2( Pdr_Man_t * p, int k, Aig_Obj_t * pObj, int Level, int Pol )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    int fNewVar = 0, iVarThis  = Pdr_ObjSatVar2FindOrAdd( p, k, pObj, &fNewVar );
    int * pLit, i, iVar, iClaBeg, iClaEnd, RetValue;
    if ( Aig_ObjIsCi(pObj) || !fNewVar )
        return iVarThis;
    iClaBeg = p->pCnf2->pObj2Clause[Aig_ObjId(pObj)];
    iClaEnd = iClaBeg + p->pCnf2->pObj2Count[Aig_ObjId(pObj)];
    assert( iClaBeg < iClaEnd );
    pSat = Pdr_ManSolver(p, k);
    vLits = Vec_WecEntry( p->vVLits, Level );
    for ( i = iClaBeg; i < iClaEnd; i++ )
    {
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit( iVarThis, Abc_LitIsCompl(p->pCnf2->pClauses[i][0]) ) );
        for ( pLit = p->pCnf2->pClauses[i]+1; pLit < p->pCnf2->pClauses[i+1]; pLit++ )
        {
            iVar = Pdr_ObjSatVar2( p, k, Aig_ManObj(p->pAig, Abc_Lit2Var(*pLit)), Level+1, Pol );
            Vec_IntPush( vLits, Abc_Var2Lit( iVar, Abc_LitIsCompl(*pLit) ) );
        }
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits) );
        assert( RetValue );
        (void) RetValue;
    }
    return iVarThis;
}